

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndexedTest.cpp
# Opt level: O2

void __thiscall
vkt::Draw::anon_unknown_10::DrawIndexed::DrawIndexed
          (DrawIndexed *this,Context *context,TestSpec *testSpec)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  VkPrimitiveTopology VVar1;
  char *vertexShaderName;
  DrawIndexed *this_01;
  mapped_type *ppcVar2;
  int iVar3;
  bool bVar4;
  RGBA local_1bc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1b8;
  vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_> *local_1b0;
  VertexElementData local_1a4;
  DrawIndexed *local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [24];
  Vec4 local_d0;
  Vec4 local_c0;
  Vec4 local_b0;
  Vec4 local_a0;
  Vec4 local_90;
  Vec4 local_80;
  Vec4 local_70;
  Vec4 local_60;
  Vec4 local_50;
  Vec4 local_40;
  
  local_1a4.super_PositionColorVertex.position.m_data[0] = 0.0;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](&testSpec->shaders,(key_type *)&local_1a4);
  vertexShaderName = *ppcVar2;
  local_1bc.m_value = 1;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](&testSpec->shaders,&local_1bc.m_value);
  DrawTestsBaseClass::DrawTestsBaseClass
            (&this->super_DrawTestsBaseClass,context,vertexShaderName,*ppcVar2,testSpec->topology);
  (this->super_DrawTestsBaseClass).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__DrawIndexed_00c04d50;
  this_00 = &this->m_indexes;
  (this->m_indexBuffer).m_state = (SharedPtrStateBase *)0x0;
  (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_indexBuffer).m_ptr = (Buffer *)0x0;
  VVar1 = (this->super_DrawTestsBaseClass).m_topology;
  local_180 = this;
  if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
    local_1a4.super_PositionColorVertex.position.m_data[0] = 0.0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
    local_1a4.super_PositionColorVertex.position.m_data[0] = 0.0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
    local_1a4.super_PositionColorVertex.position.m_data[0] = 2.8026e-45;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
    local_1a4.super_PositionColorVertex.position.m_data[0] = 0.0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
    local_1a4.super_PositionColorVertex.position.m_data[0] = 8.40779e-45;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
    local_1a4.super_PositionColorVertex.position.m_data[0] = 7.00649e-45;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
    local_1a4.super_PositionColorVertex.position.m_data[0] = 0.0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
    local_1a4.super_PositionColorVertex.position.m_data[0] = 9.80909e-45;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
  }
  else if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
    local_1a4.super_PositionColorVertex.position.m_data[0] = 0.0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
    local_1a4.super_PositionColorVertex.position.m_data[0] = 0.0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
    local_1a4.super_PositionColorVertex.position.m_data[0] = 2.8026e-45;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
    local_1a4.super_PositionColorVertex.position.m_data[0] = 0.0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
    local_1a4.super_PositionColorVertex.position.m_data[0] = 8.40779e-45;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
    local_1a4.super_PositionColorVertex.position.m_data[0] = 8.40779e-45;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
    local_1a4.super_PositionColorVertex.position.m_data[0] = 0.0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
    local_1a4.super_PositionColorVertex.position.m_data[0] = 9.80909e-45;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,(uint *)&local_1a4);
  }
  local_1b0 = &(this->super_DrawTestsBaseClass).m_data;
  iVar3 = 0xd;
  local_1b8 = this_00;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    local_e8._0_4_ = -1.0;
    local_e8._4_4_ = 1.0;
    local_e8._8_8_ = &DAT_3f8000003f800000;
    local_1bc.m_value = 0xffff0000;
    tcu::RGBA::toVec(&local_1bc);
    VertexElementData::VertexElementData(&local_1a4,(Vec4 *)local_e8,&local_40,0xffffffff);
    std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
    emplace_back<vkt::Draw::VertexElementData>(local_1b0,&local_1a4);
  }
  local_f8._0_4_ = -0.3;
  local_f8._4_4_ = 0.3;
  local_f8._8_8_ = &DAT_3f8000003f800000;
  local_1bc.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_1bc);
  VertexElementData::VertexElementData(&local_1a4,(Vec4 *)local_f8,&local_50,0xd);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(local_1b0,&local_1a4);
  this_01 = local_180;
  local_108._0_4_ = -1.0;
  local_108._4_4_ = 1.0;
  local_108._8_8_ = &DAT_3f8000003f800000;
  local_1bc.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_1bc);
  VertexElementData::VertexElementData(&local_1a4,(Vec4 *)local_108,&local_60,0xe);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(local_1b0,&local_1a4);
  local_118._0_4_ = -0.3;
  local_118._4_4_ = -0.3;
  local_118._8_8_ = &DAT_3f8000003f800000;
  local_1bc.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_1bc);
  VertexElementData::VertexElementData(&local_1a4,(Vec4 *)local_118,&local_70,0xf);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(local_1b0,&local_1a4);
  local_128._0_4_ = 1.0;
  local_128._4_4_ = -1.0;
  local_128._8_8_ = &DAT_3f8000003f800000;
  local_1bc.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_1bc);
  VertexElementData::VertexElementData(&local_1a4,(Vec4 *)local_128,&local_80,0x10);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(local_1b0,&local_1a4);
  local_138._0_4_ = -0.3;
  local_138._4_4_ = -0.3;
  local_138._8_8_ = &DAT_3f8000003f800000;
  local_1bc.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_1bc);
  VertexElementData::VertexElementData(&local_1a4,(Vec4 *)local_138,&local_90,0x11);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(local_1b0,&local_1a4);
  local_148._0_4_ = 0.3;
  local_148._4_4_ = 0.3;
  local_148._8_8_ = &DAT_3f8000003f800000;
  local_1bc.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_1bc);
  VertexElementData::VertexElementData(&local_1a4,(Vec4 *)local_148,&local_a0,0x12);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(local_1b0,&local_1a4);
  local_158._0_4_ = 0.3;
  local_158._4_4_ = -0.3;
  local_158._8_8_ = &DAT_3f8000003f800000;
  local_1bc.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_1bc);
  VertexElementData::VertexElementData(&local_1a4,(Vec4 *)local_158,&local_b0,0x13);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(local_1b0,&local_1a4);
  local_168._0_4_ = 0.3;
  local_168._4_4_ = 0.3;
  local_168._8_8_ = &DAT_3f8000003f800000;
  local_1bc.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_1bc);
  VertexElementData::VertexElementData(&local_1a4,(Vec4 *)local_168,&local_c0,0x14);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(local_1b0,&local_1a4);
  local_178._0_4_ = -1.0;
  local_178._4_4_ = 1.0;
  local_178._8_8_ = &DAT_3f8000003f800000;
  local_1bc.m_value = 0xffff0000;
  tcu::RGBA::toVec(&local_1bc);
  VertexElementData::VertexElementData(&local_1a4,(Vec4 *)local_178,&local_d0,0xffffffff);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(local_1b0,&local_1a4);
  DrawTestsBaseClass::initialize(&this_01->super_DrawTestsBaseClass);
  return;
}

Assistant:

DrawIndexed::DrawIndexed (Context &context, TestSpec testSpec)
	: DrawTestsBaseClass(context, testSpec.shaders[glu::SHADERTYPE_VERTEX], testSpec.shaders[glu::SHADERTYPE_FRAGMENT], testSpec.topology)
{
	switch (m_topology)
	{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			m_indexes.push_back(0);
			m_indexes.push_back(0);
			m_indexes.push_back(2);
			m_indexes.push_back(0);
			m_indexes.push_back(6);
			m_indexes.push_back(6);
			m_indexes.push_back(0);
			m_indexes.push_back(7);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			m_indexes.push_back(0);
			m_indexes.push_back(0);
			m_indexes.push_back(2);
			m_indexes.push_back(0);
			m_indexes.push_back(6);
			m_indexes.push_back(5);
			m_indexes.push_back(0);
			m_indexes.push_back(7);
			break;

		case vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_PATCH_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LAST:
			DE_FATAL("Topology not implemented");
			break;
		default:
			DE_FATAL("Unknown topology");
			break;
	}

	for (int unusedIdx = 0; unusedIdx < VERTEX_OFFSET; unusedIdx++)
	{
		m_data.push_back(VertexElementData(tcu::Vec4(-1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec(), -1));
	}

	int vertexIndex = VERTEX_OFFSET;

	m_data.push_back(VertexElementData(tcu::Vec4(	-0.3f,	 0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	-1.0f,	 1.0f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	-0.3f,	-0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 1.0f,	-1.0f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	-0.3f,	-0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 0.3f,	 0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 0.3f,	-0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 0.3f,	 0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));

	m_data.push_back(VertexElementData(tcu::Vec4(	-1.0f,	 1.0f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), -1));

	initialize();
}